

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteSectionHeader
          (BinaryWriter *this,char *desc,BinarySection section_code)

{
  Offset OVar1;
  char *desc_00;
  
  if (this->last_section_leb_size_guess_ == 0) {
    WriteHeader(this,desc,-1);
    Stream::WriteU8(this->stream_,section_code,"section code",No);
    this->last_section_type_ = section_code;
    this->last_section_leb_size_guess_ = 1;
    OVar1 = WriteU32Leb128Space(this,0x1b4b76,desc_00);
    this->last_section_offset_ = OVar1;
    this->last_section_payload_offset_ = this->stream_->offset_;
    return;
  }
  __assert_fail("last_section_leb_size_guess_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/binary-writer.cc"
                ,0x1ed,
                "void wabt::(anonymous namespace)::BinaryWriter::WriteSectionHeader(const char *, BinarySection)"
               );
}

Assistant:

void BinaryWriter::WriteSectionHeader(const char* desc,
                                      BinarySection section_code) {
  assert(last_section_leb_size_guess_ == 0);
  WriteHeader(desc, PRINT_HEADER_NO_INDEX);
  stream_->WriteU8Enum(section_code, "section code");
  last_section_type_ = section_code;
  last_section_leb_size_guess_ = LEB_SECTION_SIZE_GUESS;
  last_section_offset_ =
      WriteU32Leb128Space(LEB_SECTION_SIZE_GUESS, "section size (guess)");
  last_section_payload_offset_ = stream_->offset();
}